

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

char * serial_serialize(serial s,value v,size_t *size,memory_allocator allocator)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char *buffer;
  serial_handle handle;
  char *local_8;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    log_write_impl_va("metacall",0x47,"serial_serialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                      ,3,"Invalid serialization arguments");
    local_8 = (char *)0x0;
  }
  else {
    lVar2 = plugin_iface(in_RDI);
    lVar2 = (**(code **)(lVar2 + 8))(in_RCX);
    if (lVar2 == 0) {
      log_write_impl_va("metacall",0x50,"serial_serialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                        ,3,"Invalid serial implementation handle initialization");
      local_8 = (char *)0x0;
    }
    else {
      lVar3 = plugin_iface(in_RDI);
      local_8 = (char *)(**(code **)(lVar3 + 0x10))(lVar2,in_RSI,in_RDX);
      if (local_8 == (char *)0x0) {
        log_write_impl_va("metacall",0x59,"serial_serialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                          ,3,"Invalid serial implementation handle serialization");
      }
      lVar3 = plugin_iface(in_RDI);
      iVar1 = (**(code **)(lVar3 + 0x20))(lVar2);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x5e,"serial_serialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                          ,3,"Invalid serial implementation handle destruction");
      }
    }
  }
  return local_8;
}

Assistant:

char *serial_serialize(serial s, value v, size_t *size, memory_allocator allocator)
{
	if (s == NULL || v == NULL || size == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serialization arguments");

		return NULL;
	}

	serial_handle handle = serial_iface(s)->initialize(allocator);

	if (handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle initialization");

		return NULL;
	}

	char *buffer = serial_iface(s)->serialize(handle, v, size);

	if (buffer == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle serialization");
	}

	if (serial_iface(s)->destroy(handle) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle destruction");
	}

	return buffer;
}